

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.cc
# Opt level: O0

void __thiscall
mp::internal::NLFileReader<MockFile>::Open(NLFileReader<MockFile> *this,CStringRef filename)

{
  int iVar1;
  _func_int **pp_Var2;
  undefined4 extraout_var;
  ulong uVar3;
  MockFile *in_RDI;
  size_t remainder;
  size_t page_size;
  _func_int **local_188;
  undefined8 in_stack_fffffffffffffea0;
  MockFile *in_stack_fffffffffffffea8;
  CStringRef in_stack_fffffffffffffeb0;
  MockFile local_140;
  
  MockFile::MockFile(in_stack_fffffffffffffea8,in_stack_fffffffffffffeb0,
                     (int)((ulong)in_stack_fffffffffffffea0 >> 0x20));
  MockFile::operator=(in_RDI,&local_140);
  MockFile::~MockFile(in_RDI);
  MockFile::size(in_RDI);
  pp_Var2 = (_func_int **)
            ConvertFileToMmapSize((LongLong)in_stack_fffffffffffffea8,in_stack_fffffffffffffeb0);
  in_RDI[1].gmockconst0_descriptor_35.super_FunctionMockerBase<int_()>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase = pp_Var2;
  iVar1 = fmt::getpagesize();
  uVar3 = (ulong)in_RDI[1].gmockconst0_descriptor_35.super_FunctionMockerBase<int_()>.
                 super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase %
          CONCAT44(extraout_var,iVar1);
  if (uVar3 == 0) {
    local_188 = in_RDI[1].gmockconst0_descriptor_35.super_FunctionMockerBase<int_()>.
                super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase;
  }
  else {
    local_188 = (_func_int **)
                ((long)in_RDI[1].gmockconst0_descriptor_35.super_FunctionMockerBase<int_()>.
                       super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase +
                (CONCAT44(extraout_var,iVar1) - uVar3));
  }
  in_RDI[1].gmockconst0_descriptor_35.super_FunctionMockerBase<int_()>.
  super_UntypedFunctionMockerBase.mock_obj_ = local_188;
  return;
}

Assistant:

void mp::internal::NLFileReader<File>::Open(fmt::CStringRef filename) {
  file_ = File(filename, fmt::File::RDONLY | fmt::File::BINARY);
  size_ = ConvertFileToMmapSize(file_.size(), filename);
  // Round size up to a multiple of page_size. The remainded of the last
  // partial page is zero-filled both on POSIX and Windows so the resulting
  // memory buffer is zero terminated.
  std::size_t page_size = fmt::getpagesize();
  std::size_t remainder = size_ % page_size;
  rounded_size_ = remainder != 0 ? (size_ + page_size - remainder) : size_;
}